

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devices.cpp
# Opt level: O3

void __thiscall CDevice::AddPage(CDevice *this,byte *memory,int32_t size)

{
  CDevicePage *pCVar1;
  int iVar2;
  
  iVar2 = this->PagesCount;
  if (iVar2 == 0x400) {
    ErrorInt("Can\'t add more pages, already at max",0x400,FATAL);
    iVar2 = this->PagesCount;
  }
  pCVar1 = (CDevicePage *)operator_new(0x10);
  pCVar1->Size = size;
  pCVar1->Number = iVar2;
  pCVar1->RAM = memory;
  if (memory == (byte *)0x0) {
    Error("No memory defined",(char *)0x0,FATAL);
    iVar2 = this->PagesCount;
  }
  this->Pages[iVar2] = pCVar1;
  this->PagesCount = iVar2 + 1;
  return;
}

Assistant:

void CDevice::AddPage(byte* memory, int32_t size) {
	if (CDeviceDef::MAX_PAGE_N == PagesCount) ErrorInt("Can't add more pages, already at max", CDeviceDef::MAX_PAGE_N, FATAL);
	Pages[PagesCount] = new CDevicePage(memory, size, PagesCount);
	PagesCount++;
}